

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask17_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar1 = in[1];
  vpmovsxbd_avx(ZEXT416(0x241c140c));
  uVar2 = in[0xd];
  uVar3 = in[0xf];
  uVar4 = in[0x13];
  *out = uVar1 << 0x11 | *in;
  uVar5 = in[0xb];
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar2));
  auVar9 = vpmovsxbd_avx(ZEXT416(0x2010004));
  auVar9 = vpermi2d_avx512vl(auVar9,auVar8,ZEXT416(uVar1));
  auVar7 = vpsrlvd_avx2(auVar9,_DAT_00197700);
  vpmovsxbd_avx(ZEXT416(0x20181008));
  auVar9 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar2));
  auVar9 = vpsllvd_avx2(auVar9,_DAT_00197660);
  auVar10 = vpsllvd_avx2(auVar8,_DAT_0019c040);
  auVar10 = vpternlogd_avx512vl(auVar10,auVar9,auVar7,0xfe);
  uVar1 = in[10];
  auVar9 = vpshufd_avx(auVar8,0xff);
  auVar9 = vpinsrd_avx(auVar9,uVar5,1);
  *(undefined1 (*) [16])(out + 1) = auVar10;
  uVar6 = in[0xe];
  auVar7 = vpsrlvd_avx2(auVar9,_DAT_0019a140);
  auVar9 = vpinsrd_avx(ZEXT416(uVar5),uVar2,1);
  auVar10 = vpsllvd_avx2(auVar9,_DAT_001a46b0);
  auVar9 = vpinsrd_avx(ZEXT416(uVar1),in[0xc],1);
  auVar9 = vpsllvd_avx2(auVar9,_DAT_0019a150);
  uVar1 = in[0x10];
  auVar9 = vpternlogd_avx512vl(auVar10,auVar9,auVar7,0xfe);
  *(long *)(out + 5) = auVar9._0_8_;
  out[7] = uVar3 << 0x1f | uVar6 << 0xe | uVar2 >> 3;
  uVar2 = in[0x12];
  out[8] = uVar1 << 0x10 | uVar3 >> 1;
  uVar3 = in[0x14];
  out[9] = uVar2 << 0x12 | in[0x11] * 2 | uVar1 >> 0x10;
  out[10] = uVar3 << 0x14 | uVar4 << 3 | uVar2 >> 0xe;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(in + 0x16);
  auVar10 = vpsllvd_avx2(auVar9,_DAT_001a4c50);
  auVar9 = vpinsrd_avx(ZEXT416(in[0x15] << 5 | uVar3 >> 0xc),
                       (uint)(*(ulong *)(in + 0x16) >> 10) & 0x3fffff,1);
  auVar9 = vpor_avx(auVar10,auVar9);
  *(long *)(out + 0xb) = auVar9._0_8_;
  return out + 0xd;
}

Assistant:

uint32_t *__fastpackwithoutmask17_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (17 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (17 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (17 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (17 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (17 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (17 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (17 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (17 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (17 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (17 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (17 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (17 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;

  return out + 1;
}